

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetFilenameComponentCommand.h
# Opt level: O0

cmCommand * __thiscall cmGetFilenameComponentCommand::Clone(cmGetFilenameComponentCommand *this)

{
  cmCommand *this_00;
  cmGetFilenameComponentCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmGetFilenameComponentCommand((cmGetFilenameComponentCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmGetFilenameComponentCommand;
    }